

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O0

int RunGLTest(int argc,char **argv,int logo,int logocursor,int slowly,int bpp,float gamma,
             int noframe,int fsaa,int sync,int accel)

{
  FILE *pFVar1;
  int iVar2;
  float fVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 local_148 [8];
  SDL_Event event;
  char *sdl_error;
  uint local_120;
  GLenum gl_error;
  int value;
  Uint32 video_flags;
  float cube [8] [3];
  float color [8] [3];
  Uint32 this_time;
  Uint32 start_time;
  int frames;
  int done;
  int h;
  int w;
  int rgb_size [3];
  int i;
  float gamma_local;
  int bpp_local;
  int slowly_local;
  int logocursor_local;
  int logo_local;
  char **argv_local;
  int argc_local;
  
  start_time = 0;
  memcpy(cube[7] + 1,&DAT_00104490,0x60);
  memcpy(&value,&DAT_001044f0,0x60);
  iVar2 = SDL_Init(0x20);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar4 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar4);
    exit(1);
  }
  i = bpp;
  if (bpp == 0) {
    lVar5 = SDL_GetVideoInfo();
    if (*(byte *)(*(long *)(lVar5 + 8) + 8) < 9) {
      i = 8;
    }
    else {
      i = 0x10;
    }
  }
  if ((logo == 0) || (USE_DEPRECATED_OPENGLBLIT == SDL_FALSE)) {
    gl_error = 2;
  }
  else {
    gl_error = 10;
  }
  for (rgb_size[1] = 1; argv[rgb_size[1]] != (char *)0x0; rgb_size[1] = rgb_size[1] + 1) {
    iVar2 = strcmp(argv[rgb_size[1]],"-fullscreen");
    if (iVar2 == 0) {
      gl_error = gl_error | 0x80000000;
    }
  }
  if (noframe != 0) {
    gl_error = gl_error | 0x20;
  }
  if (i == 8) {
    h = 3;
    w = 3;
    rgb_size[0] = 2;
  }
  else if (i - 0xfU < 2) {
    h = 5;
    w = 5;
    rgb_size[0] = 5;
  }
  else {
    h = 8;
    w = 8;
    rgb_size[0] = 8;
  }
  SDL_GL_SetAttribute(0,h);
  SDL_GL_SetAttribute(1,w);
  SDL_GL_SetAttribute(2,rgb_size[0]);
  SDL_GL_SetAttribute(6,0x10);
  SDL_GL_SetAttribute(5,1);
  if (fsaa != 0) {
    SDL_GL_SetAttribute(0xd,1);
    SDL_GL_SetAttribute(0xe,fsaa);
  }
  if (accel != 0) {
    SDL_GL_SetAttribute(0xf,1);
  }
  if (sync == 0) {
    SDL_GL_SetAttribute(0x10,0);
  }
  else {
    SDL_GL_SetAttribute(0x10,1);
  }
  lVar5 = SDL_SetVideoMode(0x280,0x1e0,i,gl_error);
  pFVar1 = _stderr;
  if (lVar5 != 0) {
    lVar5 = SDL_GetVideoSurface();
    printf("Screen BPP: %d\n",(ulong)*(byte *)(*(long *)(lVar5 + 8) + 8));
    printf("\n");
    uVar4 = glGetString(0x1f00);
    printf("Vendor     : %s\n",uVar4);
    uVar4 = glGetString(0x1f01);
    printf("Renderer   : %s\n",uVar4);
    uVar4 = glGetString(0x1f02);
    printf("Version    : %s\n",uVar4);
    uVar4 = glGetString(0x1f03);
    printf("Extensions : %s\n",uVar4);
    printf("\n");
    SDL_GL_GetAttribute(0,&local_120);
    printf("SDL_GL_RED_SIZE: requested %d, got %d\n",(ulong)(uint)h,(ulong)local_120);
    SDL_GL_GetAttribute(1,&local_120);
    printf("SDL_GL_GREEN_SIZE: requested %d, got %d\n",(ulong)(uint)w,(ulong)local_120);
    SDL_GL_GetAttribute(2,&local_120);
    printf("SDL_GL_BLUE_SIZE: requested %d, got %d\n",(ulong)(uint)rgb_size[0],(ulong)local_120);
    SDL_GL_GetAttribute(6,&local_120);
    printf("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",(ulong)(uint)i,(ulong)local_120);
    SDL_GL_GetAttribute(5,&local_120);
    printf("SDL_GL_DOUBLEBUFFER: requested 1, got %d\n",(ulong)local_120);
    if (fsaa != 0) {
      SDL_GL_GetAttribute(0xd,&local_120);
      printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",(ulong)local_120);
      SDL_GL_GetAttribute(0xe,&local_120);
      printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",(ulong)(uint)fsaa,(ulong)local_120)
      ;
    }
    if (accel != 0) {
      SDL_GL_GetAttribute(0xf,&local_120);
      printf("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",(ulong)local_120);
    }
    if (sync != 0) {
      SDL_GL_GetAttribute(0x10,&local_120);
      printf("SDL_GL_SWAP_CONTROL: requested 1, got %d\n",(ulong)local_120);
    }
    SDL_WM_SetCaption("SDL GL test","testgl");
    if ((gamma != 0.0) || (NAN(gamma))) {
      SDL_SetGamma(gamma,gamma,gamma);
    }
    glViewport(0,0,0x280,0x1e0);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0xc000000000000000,0x4000000000000000,0xc000000000000000,0x4000000000000000,
            0xc034000000000000,0x4034000000000000);
    glMatrixMode(0x1700);
    glLoadIdentity();
    glEnable(0xb71);
    glDepthFunc(0x201);
    glShadeModel(0x1d01);
    fVar3 = (float)SDL_GetTicks();
    this_time = 0;
    while (start_time == 0) {
      glClearColor(0,0,0,0x3f800000);
      glClear(0x4100);
      glBegin(7);
      glColor3fv(cube[7] + 1);
      glVertex3fv(&value);
      glColor3fv(color[0] + 1);
      glVertex3fv(cube[0] + 1);
      glColor3fv(color[1] + 1);
      glVertex3fv(cube[1] + 1);
      glColor3fv(color[2] + 1);
      glVertex3fv(cube[2] + 1);
      glColor3fv(color[2] + 1);
      glVertex3fv(cube[2] + 1);
      glColor3fv(color[3] + 1);
      glVertex3fv(cube[3] + 1);
      glColor3fv(color[6] + 1);
      glVertex3fv(cube[6] + 1);
      glColor3fv(color[1] + 1);
      glVertex3fv(cube[1] + 1);
      glColor3fv(cube[7] + 1);
      glVertex3fv(&value);
      glColor3fv(color[4] + 1);
      glVertex3fv(cube[4] + 1);
      glColor3fv(color[5] + 1);
      glVertex3fv(cube[5] + 1);
      glColor3fv(color[0] + 1);
      glVertex3fv(cube[0] + 1);
      glColor3fv(color[4] + 1);
      glVertex3fv(cube[4] + 1);
      glColor3fv(color[3] + 1);
      glVertex3fv(cube[3] + 1);
      glColor3fv(color[6] + 1);
      glVertex3fv(cube[6] + 1);
      glColor3fv(color[5] + 1);
      glVertex3fv(cube[5] + 1);
      glColor3fv(color[4] + 1);
      glVertex3fv(cube[4] + 1);
      glColor3fv(cube[7] + 1);
      glVertex3fv(&value);
      glColor3fv(color[2] + 1);
      glVertex3fv(cube[2] + 1);
      glColor3fv(color[3] + 1);
      glVertex3fv(cube[3] + 1);
      glColor3fv(color[5] + 1);
      glVertex3fv(cube[5] + 1);
      glColor3fv(color[0] + 1);
      glVertex3fv(cube[0] + 1);
      glColor3fv(color[1] + 1);
      glVertex3fv(cube[1] + 1);
      glColor3fv(color[6] + 1);
      glVertex3fv(cube[6] + 1);
      glEnd();
      glMatrixMode(0x1700);
      glRotatef(0x40a00000,0x3f800000);
      if (logo != 0) {
        if (USE_DEPRECATED_OPENGLBLIT == SDL_FALSE) {
          DrawLogoTexture();
        }
        else {
          DrawLogoBlit();
        }
      }
      if (logocursor != 0) {
        DrawLogoCursor();
      }
      SDL_GL_SwapBuffers();
      sdl_error._4_4_ = glGetError();
      if (sdl_error._4_4_ != 0) {
        fprintf(_stderr,"testgl: OpenGL error: %d\n",(ulong)sdl_error._4_4_);
      }
      event.user.data2 = (void *)SDL_GetError();
      if (*event.user.data2 != '\0') {
        fprintf(_stderr,"testgl: SDL error \'%s\'\n",event.user.data2);
        SDL_ClearError();
      }
      if (slowly != 0) {
        SDL_Delay(0x14);
      }
      while (iVar2 = SDL_PollEvent(local_148), iVar2 != 0) {
        start_time = HandleEvent((SDL_Event *)local_148);
      }
      this_time = this_time + 1;
    }
    color[7][2] = (float)SDL_GetTicks();
    if (color[7][2] != fVar3) {
      printf("%2.2f FPS\n",
             (double)((float)(int)this_time / (float)(uint)((int)color[7][2] - (int)fVar3)) * 1000.0
            );
    }
    if (global_image != (SDL_Surface *)0x0) {
      SDL_FreeSurface(global_image);
      global_image = (SDL_Surface *)0x0;
    }
    if (global_texture != 0) {
      glDeleteTextures(1,&global_texture);
      global_texture = 0;
    }
    if (cursor_texture != 0) {
      glDeleteTextures(1,&cursor_texture);
      cursor_texture = 0;
    }
    SDL_Quit();
    return 0;
  }
  uVar4 = SDL_GetError();
  fprintf(pFVar1,"Couldn\'t set GL mode: %s\n",uVar4);
  SDL_Quit();
  exit(1);
}

Assistant:

int RunGLTest( int argc, char* argv[],
               int logo, int logocursor, int slowly, int bpp, float gamma, int noframe, int fsaa, int sync, int accel )
{
	int i;
	int rgb_size[3];
	int w = 640;
	int h = 480;
	int done = 0;
	int frames;
	Uint32 start_time, this_time;
        float color[8][3]= {{ 1.0,  1.0,  0.0}, 
			    { 1.0,  0.0,  0.0},
			    { 0.0,  0.0,  0.0},
			    { 0.0,  1.0,  0.0},
			    { 0.0,  1.0,  1.0},
			    { 1.0,  1.0,  1.0},
			    { 1.0,  0.0,  1.0},
			    { 0.0,  0.0,  1.0}};
	float cube[8][3]= {{ 0.5,  0.5, -0.5}, 
			   { 0.5, -0.5, -0.5},
			   {-0.5, -0.5, -0.5},
			   {-0.5,  0.5, -0.5},
			   {-0.5,  0.5,  0.5},
			   { 0.5,  0.5,  0.5},
			   { 0.5, -0.5,  0.5},
			   {-0.5, -0.5,  0.5}};
	Uint32 video_flags;
	int value;

	if( SDL_Init( SDL_INIT_VIDEO ) < 0 ) {
		fprintf(stderr,"Couldn't initialize SDL: %s\n",SDL_GetError());
		exit( 1 );
	}

	/* See if we should detect the display depth */
	if ( bpp == 0 ) {
		if ( SDL_GetVideoInfo()->vfmt->BitsPerPixel <= 8 ) {
			bpp = 8;
		} else {
			bpp = 16;  /* More doesn't seem to work */
		}
	}

	/* Set the flags we want to use for setting the video mode */
	if ( logo && USE_DEPRECATED_OPENGLBLIT ) {
		video_flags = SDL_OPENGLBLIT;
	} else {
		video_flags = SDL_OPENGL;
	}
	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
		}
	}

        if (noframe) {
           video_flags |= SDL_NOFRAME;
        }

	/* Initialize the display */
	switch (bpp) {
	    case 8:
		rgb_size[0] = 3;
		rgb_size[1] = 3;
		rgb_size[2] = 2;
		break;
	    case 15:
	    case 16:
		rgb_size[0] = 5;
		rgb_size[1] = 5;
		rgb_size[2] = 5;
		break;
            default:
		rgb_size[0] = 8;
		rgb_size[1] = 8;
		rgb_size[2] = 8;
		break;
	}
	SDL_GL_SetAttribute( SDL_GL_RED_SIZE, rgb_size[0] );
	SDL_GL_SetAttribute( SDL_GL_GREEN_SIZE, rgb_size[1] );
	SDL_GL_SetAttribute( SDL_GL_BLUE_SIZE, rgb_size[2] );
	SDL_GL_SetAttribute( SDL_GL_DEPTH_SIZE, 16 );
	SDL_GL_SetAttribute( SDL_GL_DOUBLEBUFFER, 1 );
	if ( fsaa ) {
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLEBUFFERS, 1 );
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLESAMPLES, fsaa );
	}
	if ( accel ) {
		SDL_GL_SetAttribute( SDL_GL_ACCELERATED_VISUAL, 1 );
	}
	if ( sync ) {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 1 );
	} else {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 0 );
	}
	if ( SDL_SetVideoMode( w, h, bpp, video_flags ) == NULL ) {
		fprintf(stderr, "Couldn't set GL mode: %s\n", SDL_GetError());
		SDL_Quit();
		exit(1);
	}

	printf("Screen BPP: %d\n", SDL_GetVideoSurface()->format->BitsPerPixel);
	printf("\n");
	printf( "Vendor     : %s\n", glGetString( GL_VENDOR ) );
	printf( "Renderer   : %s\n", glGetString( GL_RENDERER ) );
	printf( "Version    : %s\n", glGetString( GL_VERSION ) );
	printf( "Extensions : %s\n", glGetString( GL_EXTENSIONS ) );
	printf("\n");

	SDL_GL_GetAttribute( SDL_GL_RED_SIZE, &value );
	printf( "SDL_GL_RED_SIZE: requested %d, got %d\n", rgb_size[0],value);
	SDL_GL_GetAttribute( SDL_GL_GREEN_SIZE, &value );
	printf( "SDL_GL_GREEN_SIZE: requested %d, got %d\n", rgb_size[1],value);
	SDL_GL_GetAttribute( SDL_GL_BLUE_SIZE, &value );
	printf( "SDL_GL_BLUE_SIZE: requested %d, got %d\n", rgb_size[2],value);
	SDL_GL_GetAttribute( SDL_GL_DEPTH_SIZE, &value );
	printf( "SDL_GL_DEPTH_SIZE: requested %d, got %d\n", bpp, value );
	SDL_GL_GetAttribute( SDL_GL_DOUBLEBUFFER, &value );
	printf( "SDL_GL_DOUBLEBUFFER: requested 1, got %d\n", value );
	if ( fsaa ) {
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLEBUFFERS, &value );
		printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value );
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLESAMPLES, &value );
		printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa, value );
	}
	if ( accel ) {
		SDL_GL_GetAttribute( SDL_GL_ACCELERATED_VISUAL, &value );
		printf( "SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value );
	}
	if ( sync ) {
		SDL_GL_GetAttribute( SDL_GL_SWAP_CONTROL, &value );
		printf( "SDL_GL_SWAP_CONTROL: requested 1, got %d\n", value );
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption( "SDL GL test", "testgl" );

	/* Set the gamma for the window */
	if ( gamma != 0.0 ) {
		SDL_SetGamma(gamma, gamma, gamma);
	}

	glViewport( 0, 0, w, h );
	glMatrixMode( GL_PROJECTION );
	glLoadIdentity( );

	glOrtho( -2.0, 2.0, -2.0, 2.0, -20.0, 20.0 );

	glMatrixMode( GL_MODELVIEW );
	glLoadIdentity( );

	glEnable(GL_DEPTH_TEST);

	glDepthFunc(GL_LESS);

	glShadeModel(GL_SMOOTH);

	/* Loop until done. */
	start_time = SDL_GetTicks();
	frames = 0;
	while( !done ) {
		GLenum gl_error;
		char* sdl_error;
		SDL_Event event;

		/* Do our drawing, too. */
		glClearColor( 0.0, 0.0, 0.0, 1.0 );
		glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

		glBegin( GL_QUADS );

#ifdef SHADED_CUBE
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);

			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);

			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
#else /* flat cube */
			glColor3f(1.0, 0.0, 0.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[3]);
			
			glColor3f(0.0, 1.0, 0.0);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[2]);
			
			glColor3f(0.0, 0.0, 1.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			
			glColor3f(0.0, 1.0, 1.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[6]);

			glColor3f(1.0, 1.0, 0.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);

			glColor3f(1.0, 0.0, 1.0);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[7]);
#endif /* SHADED_CUBE */

		glEnd( );
		
		glMatrixMode(GL_MODELVIEW);
		glRotatef(5.0, 1.0, 1.0, 1.0);

		/* Draw 2D logo onto the 3D display */
		if ( logo ) {
			if ( USE_DEPRECATED_OPENGLBLIT ) {
				DrawLogoBlit();
			} else {
				DrawLogoTexture();
			}
		}
		if ( logocursor ) {
			DrawLogoCursor();
		}

		SDL_GL_SwapBuffers( );

		/* Check for error conditions. */
		gl_error = glGetError( );

		if( gl_error != GL_NO_ERROR ) {
			fprintf( stderr, "testgl: OpenGL error: %d\n", gl_error );
		}

		sdl_error = SDL_GetError( );

		if( sdl_error[0] != '\0' ) {
			fprintf(stderr, "testgl: SDL error '%s'\n", sdl_error);
			SDL_ClearError();
		}

		/* Allow the user to see what's happening */
		if ( slowly ) {
			SDL_Delay( 20 );
		}

		/* Check if there's a pending event. */
		while( SDL_PollEvent( &event ) ) {
			done = HandleEvent(&event);
		}
		++frames;
	}

	/* Print out the frames per second */
	this_time = SDL_GetTicks();
	if ( this_time != start_time ) {
		printf("%2.2f FPS\n",
			((float)frames/(this_time-start_time))*1000.0);
	}

	if ( global_image ) {
	   	SDL_FreeSurface(global_image);
		global_image = NULL;
	}
	if ( global_texture ) {
		glDeleteTextures( 1, &global_texture );
		global_texture = 0;
	}
	if ( cursor_texture ) {
		glDeleteTextures( 1, &cursor_texture );
		cursor_texture = 0;
	}

	/* Destroy our GL context, etc. */
	SDL_Quit( );
	return(0);
}